

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O2

void __thiscall FPathTraverse::AddLineIntercepts(FPathTraverse *this,int bx,int by)

{
  divline_t *line;
  double dVar1;
  int iVar2;
  int iVar3;
  anon_union_8_2_50eab53d_for_d aVar4;
  intercept_t newintercept;
  FBlockLinesIterator it;
  intercept_t local_a0;
  divline_t local_88;
  FBlockLinesIterator local_60;
  
  local_60.minx = bx;
  local_60.maxx = bx;
  local_60.miny = by;
  local_60.maxy = by;
  FBlockLinesIterator::Reset(&local_60);
  line = &this->trace;
  while( true ) {
    aVar4.line = FBlockLinesIterator::Next(&local_60);
    if (aVar4.thing == (AActor *)0x0) break;
    iVar2 = P_PointOnDivlineSide(((aVar4.line)->v1->p).X,((aVar4.line)->v1->p).Y,line);
    iVar3 = P_PointOnDivlineSide(((aVar4.line)->v2->p).X,((aVar4.line)->v2->p).Y,line);
    if (iVar2 != iVar3) {
      local_88.x = ((aVar4.line)->v1->p).X;
      local_88.y = ((aVar4.line)->v1->p).Y;
      local_88.dx = ((DVector2 *)&((aVar4.thing)->super_DThinker).super_DObject.ObjNext)->X;
      local_88.dy = (double)((aVar4.thing)->super_DThinker).super_DObject.GCNext;
      dVar1 = P_InterceptVector(line,&local_88);
      if ((dVar1 <= 1.0) && (this->Startfrac <= dVar1)) {
        local_a0.isaline = true;
        local_a0.done = false;
        local_a0.frac = dVar1;
        local_a0.d.line = aVar4.line;
        TArray<intercept_t,_intercept_t>::Push(&intercepts,&local_a0);
      }
    }
  }
  return;
}

Assistant:

void FPathTraverse::AddLineIntercepts(int bx, int by)
{
	FBlockLinesIterator it(bx, by, bx, by, true);
	line_t *ld;

	while ((ld = it.Next()))
	{
		int 				s1;
		int 				s2;
		double 				frac;
		divline_t			dl;

		s1 = P_PointOnDivlineSide (ld->v1->fX(), ld->v1->fY(), &trace);
		s2 = P_PointOnDivlineSide (ld->v2->fX(), ld->v2->fY(), &trace);
		
		if (s1 == s2) continue;	// line isn't crossed
		
		// hit the line
		P_MakeDivline (ld, &dl);
		frac = P_InterceptVector (&trace, &dl);

		if (frac < Startfrac || frac > 1.) continue;	// behind source or beyond end point
			
		intercept_t newintercept;

		newintercept.frac = frac;
		newintercept.isaline = true;
		newintercept.done = false;
		newintercept.d.line = ld;
		intercepts.Push (newintercept);
	}
}